

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Clock.cxx
# Opt level: O1

void drawhand(double ang,float (*v) [2],Fl_Color fill,Fl_Color line)

{
  long lVar1;
  
  Fl_Graphics_Driver::push_matrix(fl_graphics_driver);
  Fl_Graphics_Driver::rotate(fl_graphics_driver,ang);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)fill);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  lVar1 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((double)v[lVar1][0],(double)v[lVar1][1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)line);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  lVar1 = 0;
  do {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
              ((double)v[lVar1][0],(double)v[lVar1][1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  Fl_Graphics_Driver::pop_matrix(fl_graphics_driver);
  return;
}

Assistant:

static void drawhand(double ang,const float v[][2],Fl_Color fill,Fl_Color line)
{
  fl_push_matrix();
  fl_rotate(ang);
  fl_color(fill);
  fl_begin_polygon();
  int i; for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_polygon();
  fl_color(line);
  fl_begin_loop();
  for (i=0; i<4; i++) fl_vertex(v[i][0],v[i][1]);
  fl_end_loop();
  fl_pop_matrix();
}